

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_matcher.c
# Opt level: O0

_Bool TokenMatcher_match_StepLine(TokenMatcher *token_matcher,Token *token)

{
  _Bool _Var1;
  _Bool _Var2;
  _Bool local_21;
  _Bool but_result;
  _Bool and_result;
  _Bool keywords_result;
  _Bool final_result;
  Token *token_local;
  TokenMatcher *token_matcher_local;
  
  if ((token == (Token *)0x0) || (token->line == (GherkinLine_conflict *)0x0)) {
    token_matcher_local._7_1_ = false;
  }
  else {
    local_21 = match_step_keywords(token,Keyword_Context,token_matcher->dialect->given_keywords);
    _Var1 = match_step_keywords(token,Keyword_Action,token_matcher->dialect->when_keywords);
    if (_Var1) {
      if (local_21) {
        token->matched_keyword_type = Keyword_Unknown;
      }
      local_21 = true;
    }
    _Var1 = match_step_keywords(token,Keyword_Outcome,token_matcher->dialect->then_keywords);
    if (_Var1) {
      if (local_21 != false) {
        token->matched_keyword_type = Keyword_Unknown;
      }
      local_21 = true;
    }
    _Var1 = match_step_keywords(token,Keyword_Conjunction,token_matcher->dialect->and_keywords);
    _Var2 = match_step_keywords(token,Keyword_Conjunction,token_matcher->dialect->but_keywords);
    if ((_Var1) || (_Var2)) {
      if (local_21 != false) {
        token->matched_keyword_type = Keyword_Unknown;
      }
      local_21 = true;
    }
    token_matcher_local._7_1_ = local_21;
  }
  return token_matcher_local._7_1_;
}

Assistant:

bool TokenMatcher_match_StepLine(TokenMatcher* token_matcher, Token* token) {
    if (!token || !token->line)
        return false;
    bool final_result = false;
    bool keywords_result = match_step_keywords(token, Keyword_Context, token_matcher->dialect->given_keywords);
    if (keywords_result) {
        final_result = true;
    }
    keywords_result = match_step_keywords(token, Keyword_Action, token_matcher->dialect->when_keywords);
    if (keywords_result) {
        if (final_result) {
	    token->matched_keyword_type = Keyword_Unknown;
	}
        final_result = true;
    }
    keywords_result = match_step_keywords(token, Keyword_Outcome, token_matcher->dialect->then_keywords);
    if (keywords_result) {
        if (final_result) {
	    token->matched_keyword_type = Keyword_Unknown;
	}
        final_result = true;
    }
    bool and_result = match_step_keywords(token, Keyword_Conjunction, token_matcher->dialect->and_keywords);
    bool but_result = match_step_keywords(token, Keyword_Conjunction, token_matcher->dialect->but_keywords);
    if (and_result || but_result) {
        if (final_result) {
	    token->matched_keyword_type = Keyword_Unknown;
	}
        final_result = true;
    }
    return final_result;
}